

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

string * __thiscall
onmt::Tokenizer::detokenize
          (string *__return_storage_ptr__,Tokenizer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *features,Ranges *ranges,bool merge_ranges)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> index_map;
  vector<onmt::Token,_std::allocator<onmt::Token>_> tokens;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<onmt::Token,_std::allocator<onmt::Token>_> local_38;
  
  local_38.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parse_tokens(this,words,features,&local_38,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58);
  detokenize_abi_cxx11_
            (__return_storage_ptr__,this,&local_38,ranges,merge_ranges,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Tokenizer::detokenize(const std::vector<std::string>& words,
                                    const std::vector<std::vector<std::string> >& features,
                                    Ranges* ranges, bool merge_ranges) const
  {
    std::vector<Token> tokens;
    std::vector<size_t> index_map;
    parse_tokens(words, features, tokens, &index_map);
    return detokenize(tokens, ranges, merge_ranges, &index_map);
  }